

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

intvector sptk::swipe::primes(int n)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  int xSz;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  intvector iVar7;
  intvector iVar8;
  
  iVar7 = onesiv(n);
  uVar3 = iVar7.x;
  iVar7._0_8_ = iVar7.v;
  xSz = sieve((swipe *)(ulong)uVar3,iVar7);
  iVar8 = makeiv(xSz);
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  uVar4 = 0;
  uVar5 = 0;
  while (uVar3 != uVar5) {
    uVar1 = uVar5 + 1;
    piVar2 = iVar7.v + uVar5;
    uVar5 = uVar1;
    if (*piVar2 == 1) {
      uVar6 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
      iVar8.v[uVar6] = (int)uVar1;
    }
  }
  free(iVar7.v);
  iVar8._4_4_ = 0;
  return iVar8;
}

Assistant:

intvector primes(int n) {
    int i, j = 0;
    intvector myOnes = onesiv(n);
    intvector myPrimes = makeiv(sieve(myOnes)); // size of the # of primes
    for (i = 0; i < myOnes.x; i++) // could start at 1
        if PRIME(myOnes.v[i])
            myPrimes.v[j++] = i + 1;
    freeiv(myOnes);
    return(myPrimes);
}